

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.h
# Opt level: O3

char * cmTargetPropertyComputer::GetLocation<cmTarget>
                 (cmTarget *tgt,string *prop,cmMessenger *messenger,cmListFileBacktrace *context)

{
  uint uVar1;
  ulong __n;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  cmTarget *pcVar6;
  size_t len;
  pointer __s1;
  string configName;
  string local_50;
  
  uVar1 = ((tgt->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  if ((3 < uVar1) && (uVar1 != 8)) {
    return (char *)(cmTarget *)0x0;
  }
  if ((GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
       ::propLOCATION_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                                   ::propLOCATION_abi_cxx11_), iVar4 != 0)) {
    GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
    ::propLOCATION_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                   ::propLOCATION_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                ::propLOCATION_abi_cxx11_,"LOCATION","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                  ::propLOCATION_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                         ::propLOCATION_abi_cxx11_);
  }
  __n = prop->_M_string_length;
  if (__n == GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
             ::propLOCATION_abi_cxx11_._M_string_length) {
    if (__n != 0) {
      __s1 = (prop->_M_dataplus)._M_p;
      iVar4 = bcmp(__s1,GetLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&,cmMessenger*,cmListFileBacktrace_const&)
                        ::propLOCATION_abi_cxx11_._M_dataplus._M_p,__n);
      if (iVar4 != 0) goto LAB_00185619;
    }
    _Var2._M_head_impl =
         (tgt->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    if (((_Var2._M_head_impl)->IsImportedTarget != false) ||
       (bVar3 = HandleLocationPropertyPolicy(&(_Var2._M_head_impl)->Name,messenger,context), bVar3))
    {
      pcVar5 = ComputeLocationForBuild<cmTarget>(tgt);
      return pcVar5;
    }
  }
  else {
    __s1 = (prop->_M_dataplus)._M_p;
LAB_00185619:
    iVar4 = strncmp(__s1,"LOCATION_",9);
    if (iVar4 == 0) {
      _Var2._M_head_impl =
           (tgt->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      if (((_Var2._M_head_impl)->IsImportedTarget != false) ||
         (bVar3 = HandleLocationPropertyPolicy(&(_Var2._M_head_impl)->Name,messenger,context), bVar3
         )) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)prop);
        pcVar6 = (cmTarget *)ComputeLocation<cmTarget>(tgt,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          return (char *)pcVar6;
        }
        return (char *)pcVar6;
      }
    }
    else if (8 < __n) {
      iVar4 = strcmp(__s1 + (__n - 9),"_LOCATION");
      if ((iVar4 == 0) && (iVar4 = strncmp(__s1,"XCODE_ATTRIBUTE_",0x10), iVar4 != 0)) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s1,__s1 + (__n - 9));
        iVar4 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar4 != 0) {
          _Var2._M_head_impl =
               (tgt->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          if (((_Var2._M_head_impl)->IsImportedTarget != false) ||
             (bVar3 = HandleLocationPropertyPolicy(&(_Var2._M_head_impl)->Name,messenger,context),
             bVar3)) {
            tgt = (cmTarget *)ComputeLocation<cmTarget>(tgt,&local_50);
          }
          else {
            tgt = (cmTarget *)0x0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (iVar4 != 0) {
          return (char *)tgt;
        }
      }
    }
  }
  return (char *)(cmTarget *)0x0;
}

Assistant:

static const char* GetLocation(Target const* tgt, std::string const& prop,
                                 cmMessenger* messenger,
                                 cmListFileBacktrace const& context)

  {
    // Watch for special "computed" properties that are dependent on
    // other properties or variables.  Always recompute them.
    if (tgt->GetType() == cmStateEnums::EXECUTABLE ||
        tgt->GetType() == cmStateEnums::STATIC_LIBRARY ||
        tgt->GetType() == cmStateEnums::SHARED_LIBRARY ||
        tgt->GetType() == cmStateEnums::MODULE_LIBRARY ||
        tgt->GetType() == cmStateEnums::UNKNOWN_LIBRARY) {
      static const std::string propLOCATION = "LOCATION";
      if (prop == propLOCATION) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                          context)) {
          return nullptr;
        }
        return ComputeLocationForBuild(tgt);
      }

      // Support "LOCATION_<CONFIG>".
      if (cmHasLiteralPrefix(prop, "LOCATION_")) {
        if (!tgt->IsImported() &&
            !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                          context)) {
          return nullptr;
        }
        std::string configName = prop.substr(9);
        return ComputeLocation(tgt, configName);
      }

      // Support "<CONFIG>_LOCATION".
      if (cmHasLiteralSuffix(prop, "_LOCATION") &&
          !cmHasLiteralPrefix(prop, "XCODE_ATTRIBUTE_")) {
        std::string configName(prop.c_str(), prop.size() - 9);
        if (configName != "IMPORTED") {
          if (!tgt->IsImported() &&
              !HandleLocationPropertyPolicy(tgt->GetName(), messenger,
                                            context)) {
            return nullptr;
          }
          return ComputeLocation(tgt, configName);
        }
      }
    }
    return nullptr;
  }